

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkFinLocalSetdown(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vList->nSize; i_00 = i_00 + 1) {
    iVar1 = Vec_IntEntry(vList,i_00);
    iVar1 = Vec_IntEntry(vPairs,iVar1 * 2);
    pVVar2 = Vec_WecEntry(vMap2,iVar1);
    pVVar2->nSize = 0;
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetdown( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2 )
{
    int i, iFin;
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntClear( vArray );
    }
}